

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

int ipc_helper(int listen_after_write)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_40;
  char *local_38;
  undefined1 local_30 [8];
  uv_buf_t buf;
  int r;
  sockaddr_in addr;
  int listen_after_write_local;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)((long)&buf.len + 4));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2dc,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  buf.len._0_4_ = uv_pipe_init(puVar2,&channel,1);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2df,"r == 0");
    abort();
  }
  uv_pipe_open(&channel,0);
  iVar1 = uv_is_readable((uv_stream_t *)&channel);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2e3,"1 == uv_is_readable((uv_stream_t*) &channel)");
    abort();
  }
  iVar1 = uv_is_writable((uv_stream_t *)&channel);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2e4,"1 == uv_is_writable((uv_stream_t*) &channel)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)&channel);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2e5,"0 == uv_is_closing((uv_handle_t*) &channel)");
    abort();
  }
  puVar2 = uv_default_loop();
  buf.len._0_4_ = uv_tcp_init(puVar2,&tcp_server);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2e8,"r == 0");
    abort();
  }
  buf.len._0_4_ = uv_tcp_bind(&tcp_server,(sockaddr *)((long)&buf.len + 4),0);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2eb,"r == 0");
    abort();
  }
  if ((listen_after_write == 0) &&
     (buf.len._0_4_ = uv_listen((uv_stream_t *)&tcp_server,0x80,ipc_on_connection),
     (int)buf.len != 0)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2ef,"r == 0");
    abort();
  }
  buf.len._0_4_ = 0;
  uVar3 = uv_buf_init("hello\n",6);
  local_40 = uVar3.base;
  local_30 = (undefined1  [8])local_40;
  local_38 = (char *)uVar3.len;
  buf.base = local_38;
  buf.len._0_4_ =
       uv_write2(&write_req,(uv_stream_t *)&channel,(uv_buf_t *)local_30,1,
                 (uv_stream_t *)&tcp_server,(uv_write_cb)0x0);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2f5,"r == 0");
    abort();
  }
  if ((listen_after_write != 0) &&
     (buf.len._0_4_ = uv_listen((uv_stream_t *)&tcp_server,0x80,ipc_on_connection),
     (int)buf.len != 0)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2f9,"r == 0");
    abort();
  }
  buf.len._0_4_ = 0;
  notify_parent_process();
  puVar2 = uv_default_loop();
  buf.len._0_4_ = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2fe,"r == 0");
    abort();
  }
  if (connection_accepted == 1) {
    if (close_cb_called != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x301,"close_cb_called == 3");
      abort();
    }
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x303,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,0x300,"connection_accepted == 1");
  abort();
}

Assistant:

int ipc_helper(int listen_after_write) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel that we
   * over which a handle will be transmitted.
   */
  struct sockaddr_in addr;
  int r;
  uv_buf_t buf;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  if (!listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&write_req, (uv_stream_t*)&channel, &buf, 1,
      (uv_stream_t*)&tcp_server, NULL);
  ASSERT(r == 0);

  if (listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  notify_parent_process();
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connection_accepted == 1);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}